

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::StartDebuggerIfEnabled(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  cmMessenger *pcVar3;
  cmDebuggerAdapter *pcVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  bool bVar6;
  undefined1 local_89;
  cmDebuggerAdapter *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX> local_30;
  
  bVar6 = true;
  if ((this->DebuggerOn == true) &&
     ((this->DebugAdapter).
      super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0)) {
    paVar1 = &local_70.field_2;
    pcVar2 = (this->DebuggerPipe)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (this->DebuggerPipe)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_string_length == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Error: --debugger-pipe must be set when debugging is enabled.\n",0x3e);
      bVar6 = false;
    }
    else {
      pcVar2 = (this->DebuggerPipe)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + (this->DebuggerPipe)._M_string_length);
      std::__shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<cmDebugger::cmDebuggerPipeConnection_POSIX>,std::__cxx11::string>
                ((__shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX,(__gnu_cxx::_Lock_policy)2>
                  *)&local_30,(allocator<cmDebugger::cmDebuggerPipeConnection_POSIX> *)&local_50,
                 &local_70);
      pcVar2 = (this->DebuggerDapLogFile)._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (this->DebuggerDapLogFile)._M_string_length);
      local_88 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cmDebugger::cmDebuggerAdapter,std::allocator<cmDebugger::cmDebuggerAdapter>,std::shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX>,std::__cxx11::string>
                (a_Stack_80,&local_88,(allocator<cmDebugger::cmDebuggerAdapter> *)&local_89,
                 &local_30,&local_50);
      _Var5._M_pi = a_Stack_80[0]._M_pi;
      pcVar4 = local_88;
      local_88 = (cmDebuggerAdapter *)0x0;
      a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (this->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->DebugAdapter).
      super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pcVar4;
      (this->DebugAdapter).
      super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Var5._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_30.
          super___shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.
                   super___shared_ptr<cmDebugger::cmDebuggerPipeConnection_POSIX,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      (pcVar3->DebuggerAdapter).
      super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->DebugAdapter).
           super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(pcVar3->DebuggerAdapter).
                         super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>
                 + 8),&(this->DebugAdapter).
                       super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
    }
  }
  return bVar6;
}

Assistant:

bool cmake::StartDebuggerIfEnabled()
{
  if (!this->GetDebuggerOn()) {
    return true;
  }

  if (DebugAdapter == nullptr) {
    if (this->GetDebuggerPipe().empty()) {
      std::cerr
        << "Error: --debugger-pipe must be set when debugging is enabled.\n";
      return false;
    }

    try {
      DebugAdapter = std::make_shared<cmDebugger::cmDebuggerAdapter>(
        std::make_shared<cmDebugger::cmDebuggerPipeConnection>(
          this->GetDebuggerPipe()),
        this->GetDebuggerDapLogFile());
    } catch (const std::runtime_error& error) {
      std::cerr << "Error: Failed to create debugger adapter.\n";
      std::cerr << error.what() << "\n";
      return false;
    }
    Messenger->SetDebuggerAdapter(DebugAdapter);
  }

  return true;
}